

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pstd.h
# Opt level: O0

vector<pbrt::Image,_pstd::pmr::polymorphic_allocator<pbrt::Image>_> * __thiscall
pstd::vector<pbrt::Image,_pstd::pmr::polymorphic_allocator<pbrt::Image>_>::operator=
          (vector<pbrt::Image,_pstd::pmr::polymorphic_allocator<pbrt::Image>_> *this,
          vector<pbrt::Image,_pstd::pmr::polymorphic_allocator<pbrt::Image>_> *other)

{
  bool bVar1;
  polymorphic_allocator<pbrt::Image> *ppVar2;
  size_t sVar3;
  vector<pbrt::Image,_pstd::pmr::polymorphic_allocator<pbrt::Image>_> *in_RSI;
  vector<pbrt::Image,_pstd::pmr::polymorphic_allocator<pbrt::Image>_> *in_RDI;
  size_t i;
  polymorphic_allocator<pbrt::Image> *in_stack_ffffffffffffffc8;
  Image *p;
  vector<pbrt::Image,_pstd::pmr::polymorphic_allocator<pbrt::Image>_> *in_stack_ffffffffffffffd0;
  polymorphic_allocator<pbrt::Image> *this_00;
  polymorphic_allocator<pbrt::Image> *local_20;
  vector<pbrt::Image,_pstd::pmr::polymorphic_allocator<pbrt::Image>_> *this_01;
  
  if (in_RDI != in_RSI) {
    this_01 = in_RDI;
    bVar1 = pmr::operator==(&in_stack_ffffffffffffffd0->alloc,in_stack_ffffffffffffffc8);
    if (bVar1) {
      swap<pbrt::Image*>(&in_RDI->ptr,&in_RSI->ptr);
      swap<unsigned_long>(&in_RDI->nAlloc,&in_RSI->nAlloc);
      swap<unsigned_long>(&in_RDI->nStored,&in_RSI->nStored);
    }
    else {
      clear(in_stack_ffffffffffffffd0);
      size(in_RSI);
      reserve(this_01,(size_t)in_RSI);
      local_20 = (polymorphic_allocator<pbrt::Image> *)0x0;
      while (this_00 = local_20, ppVar2 = (polymorphic_allocator<pbrt::Image> *)size(in_RSI),
            this_00 < ppVar2) {
        p = in_RDI->ptr + (long)local_20;
        operator[](in_RSI,(size_type)local_20);
        pmr::polymorphic_allocator<pbrt::Image>::construct<pbrt::Image,pbrt::Image>
                  (this_00,p,(Image *)0x5c1ec1);
        local_20 = (polymorphic_allocator<pbrt::Image> *)((long)&local_20->memoryResource + 1);
      }
      sVar3 = size(in_RSI);
      in_RDI->nStored = sVar3;
    }
  }
  return in_RDI;
}

Assistant:

vector &operator=(vector &&other) {
        if (this == &other)
            return *this;

        if (alloc == other.alloc) {
            pstd::swap(ptr, other.ptr);
            pstd::swap(nAlloc, other.nAlloc);
            pstd::swap(nStored, other.nStored);
        } else {
            clear();
            reserve(other.size());
            for (size_t i = 0; i < other.size(); ++i)
                alloc.template construct<T>(ptr + i, std::move(other[i]));
            nStored = other.size();
        }

        return *this;
    }